

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ushort __thiscall Js::SmallSpanSequence::GetDiff(SmallSpanSequence *this,int current,int prev)

{
  GrowingUint32HeapArray *pGVar1;
  int local_1c;
  int diff;
  int prev_local;
  int current_local;
  SmallSpanSequence *this_local;
  
  local_1c = current - prev;
  if ((local_1c < -0x8000) || (0x7ffe < local_1c)) {
    local_1c = 0x7fff;
    if (this->pActualOffsetList == (GrowingUint32HeapArray *)0x0) {
      pGVar1 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Create(4);
      this->pActualOffsetList = pGVar1;
    }
    JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Add(this->pActualOffsetList,current);
  }
  return (ushort)local_1c;
}

Assistant:

ushort SmallSpanSequence::GetDiff(int current, int prev)
    {
        int diff = current - prev;

        if ((diff) < SHRT_MIN  || (diff) >= SHRT_MAX)
        {
            diff = SHRT_MAX;

            if (!this->pActualOffsetList)
            {
                this->pActualOffsetList = JsUtil::GrowingUint32HeapArray::Create(4);
            }

            this->pActualOffsetList->Add(current);
        }

        return (ushort)diff;
    }